

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::LowerBailOnCreatedMissingValue(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  OpCode OVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IndirOpnd *pIVar5;
  Instr *pIVar6;
  LabelInstr *target;
  AddrOpnd *opnd;
  Instr *this_00;
  RegOpnd *pRVar7;
  IntConstOpnd *compareSrc2;
  Opnd *this_01;
  LowererMD *this_02;
  Lowerer *this_03;
  undefined1 local_88 [8];
  AutoReuseOpnd autoReuseCreatedFirstMissingValueOpnd;
  AutoReuseOpnd autoReuseArrayFlagsBeforeHelperCallOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34eb,"(instr)","instr");
    if (!bVar3) goto LAB_0056f3f8;
    *puVar4 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A)) && (OVar1 != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ec,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_0056f3f8;
    *puVar4 = 0;
  }
  this_01 = instr->m_dst;
  if (this_01 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ed,"(instr->GetDst())","instr->GetDst()");
    if (!bVar3) goto LAB_0056f3f8;
    *puVar4 = 0;
    this_01 = instr->m_dst;
  }
  bVar3 = IR::Opnd::IsIndirOpnd(this_01);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ee,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) goto LAB_0056f3f8;
    *puVar4 = 0;
  }
  func = instr->m_func;
  pIVar5 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  pRVar7 = pIVar5->m_baseOpnd;
  local_32[0] = (pRVar7->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34f4,"(!baseValueType.IsNotArrayOrObjectWithArray())",
                       "!baseValueType.IsNotArrayOrObjectWithArray()");
    if (!bVar3) goto LAB_0056f3f8;
    *puVar4 = 0;
  }
  autoReuseCreatedFirstMissingValueOpnd.autoDelete = false;
  autoReuseCreatedFirstMissingValueOpnd.wasInUse = false;
  autoReuseCreatedFirstMissingValueOpnd._18_6_ = 0;
  bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    bVar3 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
    if (!bVar3) goto LAB_0056f17f;
    opnd = (AddrOpnd *)0x0;
  }
  else {
LAB_0056f17f:
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRVar7->super_Opnd);
    pIVar6 = IR::Instr::New(Call,func);
    opnd = (AddrOpnd *)IR::RegOpnd::New(TyUint64,func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseCreatedFirstMissingValueOpnd.autoDelete,(Opnd *)opnd,func,
               true);
    IR::Instr::SetDst(pIVar6,(Opnd *)opnd);
    IR::Instr::InsertBefore(instr,pIVar6);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,pIVar6,HelperArray_Jit_GetArrayFlagsForArrayOrObjectWithArray,
               (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,isInHelperBlock);
  LowerOneBailOutKind(this,instr,BailOutOnMissingValue,false,false);
  pIVar6 = instr->m_next;
  bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  if (bVar3) {
    bVar3 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
    if (bVar3) {
      if (opnd != (AddrOpnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3510,"(!arrayFlagsBeforeHelperCallOpnd)",
                           "!arrayFlagsBeforeHelperCallOpnd");
        if (!bVar3) goto LAB_0056f3f8;
        *puVar4 = 0;
      }
      opnd = IR::AddrOpnd::New(&DAT_00000004,AddrOpndKindConstantVar,func,true,(Var)0x0);
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&autoReuseCreatedFirstMissingValueOpnd.autoDelete,
                 &opnd->super_Opnd,func,true);
      goto LAB_0056f320;
    }
  }
  if (opnd == (AddrOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3522,"(arrayFlagsBeforeHelperCallOpnd)","arrayFlagsBeforeHelperCallOpnd");
    if (!bVar3) {
LAB_0056f3f8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    opnd = (AddrOpnd *)0x0;
  }
LAB_0056f320:
  this_02 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_02,pIVar6,&pRVar7->super_Opnd);
  LowererMD::LoadHelperArgument(this_02,pIVar6,&opnd->super_Opnd);
  this_00 = IR::Instr::New(Call,func);
  pRVar7 = IR::RegOpnd::New(TyUint8,func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_88,&pRVar7->super_Opnd,func,true);
  IR::Instr::SetDst(this_00,&pRVar7->super_Opnd);
  IR::Instr::InsertBefore(pIVar6,this_00);
  LowererMD::ChangeToHelperCall
            (this_02,this_00,HelperArray_Jit_OperationCreatedFirstMissingValue,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  this_03 = (Lowerer *)0x0;
  compareSrc2 = IR::IntConstOpnd::New(0,(pRVar7->super_Opnd).m_type,func,true);
  InsertCompareBranch(this_03,&pRVar7->super_Opnd,&compareSrc2->super_Opnd,BrEq_A,target,pIVar6,
                      false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_88);
  IR::AutoReuseOpnd::~AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseCreatedFirstMissingValueOpnd.autoDelete);
  return;
}

Assistant:

void Lowerer::LowerBailOnCreatedMissingValue(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the first missing value was created during the helper call

        if(!(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues()))
        {
            // Record whether the array has missing values before the helper call
            arrayFlagsBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayFlagsForArrayOrObjectWithArray(base)
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array had no missing values before the helper call, and the array has missing values after the helper
        // call, then this store created the first missing value in the array and needs to bail out
        if(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues())
            (arrayFlagsBeforeHelperCall = Js::DynamicObjectFlags::HasNoMissingValues)
        createdFirstMissingValue = JavascriptArray::Jit_OperationCreatedFirstMissingValue(arrayFlagsBeforeHelperCall, base)
        test createdFirstMissingValue, createdFirstMissingValue
        jz $skipBailOut

        (Bail out with IR::BailOutOnMissingValue)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArrayOrObjectWithArray());

    IR::Opnd *arrayFlagsBeforeHelperCallOpnd = nullptr;
    IR::AutoReuseOpnd autoReuseArrayFlagsBeforeHelperCallOpnd;
    const IRType arrayFlagsType = sizeof(uintptr_t) == sizeof(uint32) ? TyUint32 : TyUint64;
    if(!(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues()))
    {
        // Record whether the array has missing values before the helper call
        //     arrayFlagsBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayFlagsForArrayOrObjectWithArray(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        arrayFlagsBeforeHelperCallOpnd = IR::RegOpnd::New(arrayFlagsType, func);
        autoReuseArrayFlagsBeforeHelperCallOpnd.Initialize(arrayFlagsBeforeHelperCallOpnd, func);
        callInstr->SetDst(arrayFlagsBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayFlagsForArrayOrObjectWithArray);
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnMissingValue, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array had no missing values before the helper call, and the array has missing values after the helper
    // call, then this store created the first missing value in the array and needs to bail out

    if(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues())
    {
        //     (arrayFlagsBeforeHelperCall = Js::DynamicObjectFlags::HasNoMissingValues)
        Assert(!arrayFlagsBeforeHelperCallOpnd);
        arrayFlagsBeforeHelperCallOpnd =
            arrayFlagsType == TyUint32
                ? static_cast<IR::Opnd *>(
                    IR::IntConstOpnd::New(
                        static_cast<uintptr_t>(Js::DynamicObjectFlags::HasNoMissingValues),
                        arrayFlagsType,
                        func,
                        true))
                : IR::AddrOpnd::New(
                    reinterpret_cast<void *>(Js::DynamicObjectFlags::HasNoMissingValues),
                    IR::AddrOpndKindConstantVar,
                    func,
                    true);
        autoReuseArrayFlagsBeforeHelperCallOpnd.Initialize(arrayFlagsBeforeHelperCallOpnd, func);
    }
    else
    {
        Assert(arrayFlagsBeforeHelperCallOpnd);
    }

    //     createdFirstMissingValue = JavascriptArray::Jit_OperationCreatedFirstMissingValue(arrayFlagsBeforeHelperCall, base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, arrayFlagsBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const createdFirstMissingValueOpnd = IR::RegOpnd::New(TyUint8, func);
    IR::AutoReuseOpnd autoReuseCreatedFirstMissingValueOpnd(createdFirstMissingValueOpnd, func);
    callInstr->SetDst(createdFirstMissingValueOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationCreatedFirstMissingValue);

    //     test createdFirstMissingValue, createdFirstMissingValue
    //     jz $skipBailOut
    InsertCompareBranch(
        createdFirstMissingValueOpnd,
        IR::IntConstOpnd::New(0, createdFirstMissingValueOpnd->GetType(), func, true),
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnMissingValue)
    //     $skipBailOut:
}